

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O0

int lj_cf_buffer_method_get(lua_State *L)

{
  TValue *pTVar1;
  uint uVar2;
  SBufExt *pSVar3;
  GCstr *pGVar4;
  uint local_a4;
  uint local_9c;
  MSize len;
  MSize n;
  TValue *o;
  ptrdiff_t narg;
  ptrdiff_t arg;
  SBufExt *sbx;
  lua_State *L_local;
  
  pSVar3 = buffer_tobuf(L);
  o = (TValue *)((long)L->top - (long)L->base >> 3);
  if (o == (TValue *)0x1) {
    o = (TValue *)0x2;
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->u64 = 0xffffffffffffffff;
  }
  for (narg = 1; narg < (long)o; narg = narg + 1) {
    pTVar1 = L->base;
    if (pTVar1[narg].u64 == 0xffffffffffffffff) {
      local_a4 = 0x7fffff00;
    }
    else {
      local_a4 = lj_lib_checkintrange(L,(int)narg + 1,0,0x7fffff00);
    }
    local_9c = local_a4;
    uVar2 = (int)pSVar3->w - (int)pSVar3->r;
    if (uVar2 < local_a4) {
      local_9c = uVar2;
    }
    pGVar4 = lj_str_new(L,pSVar3->r,(ulong)local_9c);
    pTVar1[narg].u64 = (ulong)pGVar4 | 0xfffd800000000000;
    pSVar3->r = pSVar3->r + local_9c;
  }
  if ((pSVar3->r == pSVar3->w) && (((pSVar3->L).ptr64 & 2) == 0)) {
    pSVar3->w = pSVar3->b;
    pSVar3->r = pSVar3->b;
  }
  if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
    lj_gc_step(L);
  }
  return (int)o + -1;
}

Assistant:

LJLIB_CF(buffer_method_get)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobuf(L);
  ptrdiff_t arg, narg = L->top - L->base;
  if (narg == 1) {
    narg++;
    setnilV(L->top++);  /* get() is the same as get(nil). */
  }
  for (arg = 1; arg < narg; arg++) {
    TValue *o = &L->base[arg];
    MSize n = tvisnil(o) ? LJ_MAX_BUF :
	      (MSize) lj_lib_checkintrange(L, (int)(arg+1), 0, LJ_MAX_BUF);
    MSize len = sbufxlen(sbx);
    if (n > len) n = len;
    setstrV(L, o, lj_str_new(L, sbx->r, n));
    sbx->r += n;
  }
  if (sbx->r == sbx->w && !sbufiscow(sbx)) sbx->r = sbx->w = sbx->b;
  lj_gc_check(L);
  return (int)(narg-1);
}